

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O3

void __thiscall MuHash3072::Finalize(MuHash3072 *this,uint256 *out)

{
  long in_FS_OFFSET;
  uint256 result;
  uchar data [384];
  CSHA256 local_228;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  uchar local_198 [384];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  Num3072::Divide(&this->m_numerator,&this->m_denominator);
  (this->m_denominator).limbs[0] = 1;
  memset((this->m_denominator).limbs + 1,0,0x178);
  Num3072::ToBytes(&this->m_numerator,&local_198);
  local_228.buf[0x30] = '\0';
  local_228.buf[0x31] = '\0';
  local_228.buf[0x32] = '\0';
  local_228.buf[0x33] = '\0';
  local_228.buf[0x34] = '\0';
  local_228.buf[0x35] = '\0';
  local_228.buf[0x36] = '\0';
  local_228.buf[0x37] = '\0';
  local_228.buf[0x38] = '\0';
  local_228.buf[0x39] = '\0';
  local_228.buf[0x3a] = '\0';
  local_228.buf[0x3b] = '\0';
  local_228.buf[0x3c] = '\0';
  local_228.buf[0x3d] = '\0';
  local_228.buf[0x3e] = '\0';
  local_228.buf[0x3f] = '\0';
  local_228.buf[0x20] = '\0';
  local_228.buf[0x21] = '\0';
  local_228.buf[0x22] = '\0';
  local_228.buf[0x23] = '\0';
  local_228.buf[0x24] = '\0';
  local_228.buf[0x25] = '\0';
  local_228.buf[0x26] = '\0';
  local_228.buf[0x27] = '\0';
  local_228.buf[0x28] = '\0';
  local_228.buf[0x29] = '\0';
  local_228.buf[0x2a] = '\0';
  local_228.buf[0x2b] = '\0';
  local_228.buf[0x2c] = '\0';
  local_228.buf[0x2d] = '\0';
  local_228.buf[0x2e] = '\0';
  local_228.buf[0x2f] = '\0';
  local_228.buf[0x10] = '\0';
  local_228.buf[0x11] = '\0';
  local_228.buf[0x12] = '\0';
  local_228.buf[0x13] = '\0';
  local_228.buf[0x14] = '\0';
  local_228.buf[0x15] = '\0';
  local_228.buf[0x16] = '\0';
  local_228.buf[0x17] = '\0';
  local_228.buf[0x18] = '\0';
  local_228.buf[0x19] = '\0';
  local_228.buf[0x1a] = '\0';
  local_228.buf[0x1b] = '\0';
  local_228.buf[0x1c] = '\0';
  local_228.buf[0x1d] = '\0';
  local_228.buf[0x1e] = '\0';
  local_228.buf[0x1f] = '\0';
  local_228.buf[0] = '\0';
  local_228.buf[1] = '\0';
  local_228.buf[2] = '\0';
  local_228.buf[3] = '\0';
  local_228.buf[4] = '\0';
  local_228.buf[5] = '\0';
  local_228.buf[6] = '\0';
  local_228.buf[7] = '\0';
  local_228.buf[8] = '\0';
  local_228.buf[9] = '\0';
  local_228.buf[10] = '\0';
  local_228.buf[0xb] = '\0';
  local_228.buf[0xc] = '\0';
  local_228.buf[0xd] = '\0';
  local_228.buf[0xe] = '\0';
  local_228.buf[0xf] = '\0';
  local_228.s[4] = 0;
  local_228.s[5] = 0;
  local_228.s[6] = 0;
  local_228.s[7] = 0;
  local_228.s[0] = 0;
  local_228.s[1] = 0;
  local_228.s[2] = 0;
  local_228.s[3] = 0;
  local_228.bytes = 0;
  CSHA256::CSHA256(&local_228);
  CSHA256::Write(&local_228,local_198,0x180);
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  CSHA256::Finalize(&local_228,(uchar *)&local_1b8);
  *(undefined4 *)((out->super_base_blob<256U>).m_data._M_elems + 0x10) = (undefined4)local_1a8;
  *(undefined4 *)((out->super_base_blob<256U>).m_data._M_elems + 0x14) = local_1a8._4_4_;
  *(undefined4 *)((out->super_base_blob<256U>).m_data._M_elems + 0x18) = (undefined4)uStack_1a0;
  *(undefined4 *)((out->super_base_blob<256U>).m_data._M_elems + 0x1c) = uStack_1a0._4_4_;
  *(undefined4 *)(out->super_base_blob<256U>).m_data._M_elems = (undefined4)local_1b8;
  *(undefined4 *)((out->super_base_blob<256U>).m_data._M_elems + 4) = local_1b8._4_4_;
  *(undefined4 *)((out->super_base_blob<256U>).m_data._M_elems + 8) = (undefined4)uStack_1b0;
  *(undefined4 *)((out->super_base_blob<256U>).m_data._M_elems + 0xc) = uStack_1b0._4_4_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MuHash3072::Finalize(uint256& out) noexcept
{
    m_numerator.Divide(m_denominator);
    m_denominator.SetToOne();  // Needed to keep the MuHash object valid

    unsigned char data[Num3072::BYTE_SIZE];
    m_numerator.ToBytes(data);

    out = (HashWriter{} << data).GetSHA256();
}